

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiveTraverser.h
# Opt level: O1

void __thiscall
glslang::TLiveTraverser::addFunctionCall(TLiveTraverser *this,TIntermAggregate *call)

{
  int iVar1;
  undefined4 extraout_var;
  iterator iVar2;
  undefined4 extraout_var_00;
  __hashtable *__h;
  __node_gen_type __node_gen;
  
  iVar1 = (*(call->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x35])(call);
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(this->liveFunctions)._M_h,(key_type *)CONCAT44(extraout_var,iVar1));
  if (iVar2.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar1 = (*(call->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x35])(call);
    std::
    _Hashtable<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::__detail::_Identity,std::equal_to<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::hash<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,true>>>>
              ((_Hashtable<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::__detail::_Identity,std::equal_to<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::hash<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->liveFunctions,iVar1);
    iVar1 = (*(call->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x35])(call);
    pushFunction(this,(TString *)CONCAT44(extraout_var_00,iVar1));
  }
  return;
}

Assistant:

void addFunctionCall(TIntermAggregate* call)
    {
        // just use the map to ensure we process each function at most once
        if (liveFunctions.find(call->getName()) == liveFunctions.end()) {
            liveFunctions.insert(call->getName());
            pushFunction(call->getName());
        }
    }